

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testAdaptiveSampler_Test::~Sampler_testAdaptiveSampler_Test
          (Sampler_testAdaptiveSampler_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Sampler, testAdaptiveSampler)
{
    namespace thriftgen = sampling_manager::thrift;

    thriftgen::OperationSamplingStrategy strategy;
    strategy.__set_operation(kTestOperationName);
    thriftgen::ProbabilisticSamplingStrategy probabilisticSampling;
    probabilisticSampling.__set_samplingRate(kTestDefaultSamplingProbability);
    strategy.__set_probabilisticSampling(probabilisticSampling);

    thriftgen::PerOperationSamplingStrategies strategies;
    strategies.__set_defaultSamplingProbability(
        kTestDefaultSamplingProbability);
    strategies.__set_defaultLowerBoundTracesPerSecond(1.0);
    strategies.__set_perOperationStrategies({ strategy });

    AdaptiveSampler sampler(strategies, kTestDefaultMaxOperations);
    auto result =
        sampler.isSampled(TraceID(0, kTestMaxID + 10), kTestOperationName);
    ASSERT_TRUE(result.isSampled());
    CMP_TAGS(testLowerBoundExpectedTags, result.tags());

    result = sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
    ASSERT_TRUE(result.isSampled());
    CMP_TAGS(testProbablisticExpectedTags, result.tags());

    result = sampler.isSampled(TraceID(0, kTestMaxID + 10), kTestOperationName);
    ASSERT_FALSE(result.isSampled());

    result = sampler.isSampled(TraceID(0, kTestMaxID - 20),
                               kTestFirstTimeOperationName);
    ASSERT_TRUE(result.isSampled());
    CMP_TAGS(testProbablisticExpectedTags, result.tags());
}